

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_session_ecdh_curve_type(char *name,libssh2_curve_type *out_type)

{
  int iVar1;
  libssh2_curve_type local_24;
  libssh2_curve_type type;
  libssh2_curve_type *out_type_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._4_4_ = -1;
  }
  else {
    iVar1 = strcmp(name,"ecdh-sha2-nistp256");
    if (iVar1 == 0) {
      local_24 = LIBSSH2_EC_CURVE_NISTP256;
    }
    else {
      iVar1 = strcmp(name,"ecdh-sha2-nistp384");
      if (iVar1 == 0) {
        local_24 = LIBSSH2_EC_CURVE_NISTP384;
      }
      else {
        iVar1 = strcmp(name,"ecdh-sha2-nistp521");
        if (iVar1 != 0) {
          return -1;
        }
        local_24 = LIBSSH2_EC_CURVE_NISTP521;
      }
    }
    if (out_type != (libssh2_curve_type *)0x0) {
      *out_type = local_24;
    }
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

static int
kex_session_ecdh_curve_type(const char *name, libssh2_curve_type *out_type)
{
    libssh2_curve_type type;

    if(!name)
        return -1;

    if(strcmp(name, "ecdh-sha2-nistp256") == 0)
        type = LIBSSH2_EC_CURVE_NISTP256;
    else if(strcmp(name, "ecdh-sha2-nistp384") == 0)
        type = LIBSSH2_EC_CURVE_NISTP384;
    else if(strcmp(name, "ecdh-sha2-nistp521") == 0)
        type = LIBSSH2_EC_CURVE_NISTP521;
    else {
        return -1;
    }

    if(out_type) {
        *out_type = type;
    }

    return 0;
}